

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

boolean next_marker(j_decompress_ptr cinfo)

{
  byte bVar1;
  undefined8 *puVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  long *in_RDI;
  size_t bytes_in_buffer;
  JOCTET *next_input_byte;
  jpeg_source_mgr *datasrc;
  int c;
  long local_30;
  byte *local_28;
  
  puVar2 = (undefined8 *)in_RDI[5];
  local_30 = puVar2[1];
  local_28 = (byte *)*puVar2;
  while( true ) {
    if (local_30 == 0) {
      iVar3 = (*(code *)puVar2[3])(in_RDI);
      if (iVar3 == 0) {
        return 0;
      }
      local_28 = (byte *)*puVar2;
      local_30 = puVar2[1];
    }
    bVar1 = *local_28;
    while( true ) {
      local_28 = local_28 + 1;
      local_30 = local_30 + -1;
      if (bVar1 == 0xff) break;
      *(int *)(in_RDI[0x49] + 0x24) = *(int *)(in_RDI[0x49] + 0x24) + 1;
      *puVar2 = local_28;
      puVar2[1] = local_30;
      if (local_30 == 0) {
        iVar3 = (*(code *)puVar2[3])(in_RDI);
        if (iVar3 == 0) {
          return 0;
        }
        local_28 = (byte *)*puVar2;
        local_30 = puVar2[1];
      }
      bVar1 = *local_28;
    }
    do {
      if (local_30 == 0) {
        iVar3 = (*(code *)puVar2[3])(in_RDI);
        if (iVar3 == 0) {
          return 0;
        }
        local_28 = (byte *)*puVar2;
        local_30 = puVar2[1];
      }
      local_30 = local_30 + -1;
      pbVar5 = local_28 + 1;
      uVar4 = (uint)*local_28;
      local_28 = pbVar5;
    } while (uVar4 == 0xff);
    if (uVar4 != 0) break;
    *(int *)(in_RDI[0x49] + 0x24) = *(int *)(in_RDI[0x49] + 0x24) + 2;
    *puVar2 = pbVar5;
    puVar2[1] = local_30;
  }
  if (*(int *)(in_RDI[0x49] + 0x24) != 0) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x74;
    *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)(in_RDI[0x49] + 0x24);
    *(uint *)(*in_RDI + 0x30) = uVar4;
    (**(code **)(*in_RDI + 8))(in_RDI,0xffffffff);
    *(undefined4 *)(in_RDI[0x49] + 0x24) = 0;
  }
  *(uint *)((long)in_RDI + 0x21c) = uVar4;
  *puVar2 = pbVar5;
  puVar2[1] = local_30;
  return 1;
}

Assistant:

LOCAL(boolean)
next_marker(j_decompress_ptr cinfo)
{
  int c;
  INPUT_VARS(cinfo);

  for (;;) {
    INPUT_BYTE(cinfo, c, return FALSE);
    /* Skip any non-FF bytes.
     * This may look a bit inefficient, but it will not occur in a valid file.
     * We sync after each discarded byte so that a suspending data source
     * can discard the byte from its buffer.
     */
    while (c != 0xFF) {
      cinfo->marker->discarded_bytes++;
      INPUT_SYNC(cinfo);
      INPUT_BYTE(cinfo, c, return FALSE);
    }
    /* This loop swallows any duplicate FF bytes.  Extra FFs are legal as
     * pad bytes, so don't count them in discarded_bytes.  We assume there
     * will not be so many consecutive FF bytes as to overflow a suspending
     * data source's input buffer.
     */
    do {
      INPUT_BYTE(cinfo, c, return FALSE);
    } while (c == 0xFF);
    if (c != 0)
      break;                    /* found a valid marker, exit loop */
    /* Reach here if we found a stuffed-zero data sequence (FF/00).
     * Discard it and loop back to try again.
     */
    cinfo->marker->discarded_bytes += 2;
    INPUT_SYNC(cinfo);
  }

  if (cinfo->marker->discarded_bytes != 0) {
    WARNMS2(cinfo, JWRN_EXTRANEOUS_DATA, cinfo->marker->discarded_bytes, c);
    cinfo->marker->discarded_bytes = 0;
  }

  cinfo->unread_marker = c;

  INPUT_SYNC(cinfo);
  return TRUE;
}